

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_tcp_t *poVar2;
  undefined8 in_RAX;
  opj_ppx *poVar3;
  OPJ_BYTE *pOVar4;
  char *fmt;
  uint uVar5;
  OPJ_UINT32 l_Z_ppt;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xfb2,
                  "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xfb3,
                  "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xfb4,
                  "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_header_size < 2) {
    fmt = "Error reading PPT marker\n";
    goto LAB_001173ff;
  }
  if (((p_j2k->m_cp).field_0x90 & 1) != 0) {
    fmt = 
    "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n"
    ;
    goto LAB_001173ff;
  }
  poVar2 = (p_j2k->m_cp).tcps;
  uVar1 = p_j2k->m_current_tile_number;
  poVar2[uVar1].field_0x1638 = poVar2[uVar1].field_0x1638 | 2;
  opj_read_bytes_LE(p_header_data,&local_34,1);
  if (poVar2[uVar1].ppt_markers == (opj_ppx *)0x0) {
    if (poVar2[uVar1].ppt_markers_count != 0) {
      __assert_fail("l_tcp->ppt_markers_count == 0U",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0xfcd,
                    "OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    uVar5 = local_34 + 1;
    poVar3 = (opj_ppx *)opj_calloc((ulong)uVar5,0x10);
    poVar2[uVar1].ppt_markers = poVar3;
    if (poVar3 == (opj_ppx *)0x0) {
LAB_0011745f:
      opj_event_msg(p_manager,1,"Not enough memory to read PPT marker\n");
    }
    else {
      poVar2[uVar1].ppt_markers_count = uVar5;
    }
LAB_00117475:
    if (poVar3 == (opj_ppx *)0x0) {
      return 0;
    }
  }
  else if (poVar2[uVar1].ppt_markers_count <= local_34) {
    uVar5 = local_34 + 1;
    poVar3 = (opj_ppx *)opj_realloc(poVar2[uVar1].ppt_markers,(ulong)uVar5 << 4);
    if (poVar3 == (opj_ppx *)0x0) goto LAB_0011745f;
    poVar2[uVar1].ppt_markers = poVar3;
    memset(poVar3 + poVar2[uVar1].ppt_markers_count,0,
           (ulong)(uVar5 - poVar2[uVar1].ppt_markers_count) << 4);
    poVar2[uVar1].ppt_markers_count = uVar5;
    goto LAB_00117475;
  }
  if (poVar2[uVar1].ppt_markers[local_34].m_data != (OPJ_BYTE *)0x0) {
    opj_event_msg(p_manager,1,"Zppt %u already read\n");
    return 0;
  }
  uVar5 = p_header_size - 1;
  pOVar4 = (OPJ_BYTE *)opj_malloc((ulong)uVar5);
  poVar3 = poVar2[uVar1].ppt_markers;
  poVar3[local_34].m_data = pOVar4;
  if (pOVar4 != (OPJ_BYTE *)0x0) {
    poVar3[local_34].m_data_size = uVar5;
    memcpy(poVar3[local_34].m_data,p_header_data + 1,(ulong)uVar5);
    return 1;
  }
  fmt = "Not enough memory to read PPT marker\n";
LAB_001173ff:
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_read_ppt(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_Z_ppt;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    /* We need to have the Z_ppt element + 1 byte of Ippt at minimum */
    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading PPT marker\n");
        return OPJ_FALSE;
    }

    l_cp = &(p_j2k->m_cp);
    if (l_cp->ppm) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error reading PPT marker: packet header have been previously found in the main header (PPM marker).\n");
        return OPJ_FALSE;
    }

    l_tcp = &(l_cp->tcps[p_j2k->m_current_tile_number]);
    l_tcp->ppt = 1;

    opj_read_bytes(p_header_data, &l_Z_ppt, 1);             /* Z_ppt */
    ++p_header_data;
    --p_header_size;

    /* check allocation needed */
    if (l_tcp->ppt_markers == NULL) { /* first PPT marker */
        OPJ_UINT32 l_newCount = l_Z_ppt + 1U; /* can't overflow, l_Z_ppt is UINT8 */
        assert(l_tcp->ppt_markers_count == 0U);

        l_tcp->ppt_markers = (opj_ppx *) opj_calloc(l_newCount, sizeof(opj_ppx));
        if (l_tcp->ppt_markers == NULL) {
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPT marker\n");
            return OPJ_FALSE;
        }
        l_tcp->ppt_markers_count = l_newCount;
    } else if (l_tcp->ppt_markers_count <= l_Z_ppt) {
        OPJ_UINT32 l_newCount = l_Z_ppt + 1U; /* can't overflow, l_Z_ppt is UINT8 */
        opj_ppx *new_ppt_markers;
        new_ppt_markers = (opj_ppx *) opj_realloc(l_tcp->ppt_markers,
                          l_newCount * sizeof(opj_ppx));
        if (new_ppt_markers == NULL) {
            /* clean up to be done on l_tcp destruction */
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPT marker\n");
            return OPJ_FALSE;
        }
        l_tcp->ppt_markers = new_ppt_markers;
        memset(l_tcp->ppt_markers + l_tcp->ppt_markers_count, 0,
               (l_newCount - l_tcp->ppt_markers_count) * sizeof(opj_ppx));
        l_tcp->ppt_markers_count = l_newCount;
    }

    if (l_tcp->ppt_markers[l_Z_ppt].m_data != NULL) {
        /* clean up to be done on l_tcp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Zppt %u already read\n", l_Z_ppt);
        return OPJ_FALSE;
    }

    l_tcp->ppt_markers[l_Z_ppt].m_data = (OPJ_BYTE *) opj_malloc(p_header_size);
    if (l_tcp->ppt_markers[l_Z_ppt].m_data == NULL) {
        /* clean up to be done on l_tcp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPT marker\n");
        return OPJ_FALSE;
    }
    l_tcp->ppt_markers[l_Z_ppt].m_data_size = p_header_size;
    memcpy(l_tcp->ppt_markers[l_Z_ppt].m_data, p_header_data, p_header_size);
    return OPJ_TRUE;
}